

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O1

void ImDrawList_PathLineTo(ImDrawList *self,ImVec2 pos)

{
  int iVar1;
  ImVec2 *__src;
  ImVec2 *__dest;
  int iVar2;
  int iVar3;
  
  iVar3 = (self->_Path).Size;
  iVar1 = (self->_Path).Capacity;
  if (iVar3 == iVar1) {
    iVar3 = iVar3 + 1;
    if (iVar1 == 0) {
      iVar2 = 8;
    }
    else {
      iVar2 = iVar1 / 2 + iVar1;
    }
    if (iVar3 < iVar2) {
      iVar3 = iVar2;
    }
    if (iVar1 < iVar3) {
      __dest = (ImVec2 *)ImGui::MemAlloc((long)iVar3 << 3);
      __src = (self->_Path).Data;
      if (__src != (ImVec2 *)0x0) {
        memcpy(__dest,__src,(long)(self->_Path).Size << 3);
        ImGui::MemFree((self->_Path).Data);
      }
      (self->_Path).Data = __dest;
      (self->_Path).Capacity = iVar3;
    }
  }
  (self->_Path).Data[(self->_Path).Size] = pos;
  (self->_Path).Size = (self->_Path).Size + 1;
  return;
}

Assistant:

CIMGUI_API void ImDrawList_PathLineTo(ImDrawList* self,const ImVec2 pos)
{
    return self->PathLineTo(pos);
}